

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyDefinition::IfcPropertyDefinition(IfcPropertyDefinition *this)

{
  *(undefined ***)&(this->super_IfcRoot).field_0x98 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(char **)&this->field_0xa8 = "IfcPropertyDefinition";
  IfcRoot::IfcRoot(&this->super_IfcRoot,&PTR_construction_vtable_24__00746c80);
  (this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
       = (_func_int **)0x746c18;
  *(undefined8 *)&(this->super_IfcRoot).field_0x98 = 0x746c68;
  *(undefined8 *)&(this->super_IfcRoot).field_0x88 = 0x746c40;
  return;
}

Assistant:

IfcPropertyDefinition() : Object("IfcPropertyDefinition") {}